

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

Status __thiscall
soplex::SoPlexBase<double>::_solveRealStable
          (SoPlexBase<double> *this,bool acceptUnbounded,bool acceptInfeasible,
          VectorBase<double> *primal,VectorBase<double> *dual,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusRows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusCols,
          bool forceNoSimplifier)

{
  Status SVar1;
  Verbosity VVar2;
  int iVar3;
  SPxRatioTester<double> *pSVar4;
  SPxPricer<double> *pSVar5;
  byte in_DL;
  byte in_SIL;
  SoPlexBase<double> *in_RDI;
  double m;
  double dVar6;
  byte in_stack_00000010;
  Verbosity old_verbosity_10;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int type;
  int scaler;
  int simplifier;
  int pricer;
  int ratiotester;
  double markowitz;
  bool turnedoffPre;
  bool switchedPricer;
  bool switchedRatiotester;
  bool switchedSimplifier;
  bool switchedScaler;
  bool tightenedTolerances;
  bool relaxedTolerances;
  bool increasedMarkowitz;
  bool initialSolve;
  bool solvedFromScratch;
  bool solved;
  bool fromScratch;
  Status result;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_000003e8;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_000003f0;
  VectorBase<double> *in_stack_000003f8;
  VectorBase<double> *in_stack_00000400;
  undefined1 in_stack_0000040f;
  SoPlexBase<double> *in_stack_00000410;
  SPxSolverBase<double> *in_stack_fffffffffffffef8;
  SPxOut *in_stack_ffffffffffffff00;
  SPxSolverBase<double> *in_stack_ffffffffffffff08;
  SPxSolverBase<double> *in_stack_ffffffffffffff10;
  byte local_d2;
  byte local_d1;
  Verbosity local_c4;
  Verbosity local_c0 [3];
  Verbosity local_b4;
  Verbosity local_b0 [3];
  Verbosity local_a4;
  Verbosity local_a0 [3];
  Verbosity local_94;
  Verbosity local_90 [7];
  Verbosity local_74;
  Verbosity local_70 [3];
  Verbosity local_64;
  Verbosity local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  bool bVar7;
  int in_stack_ffffffffffffffc0;
  IntParam param;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  
  uVar15 = 0;
  uVar14 = 0;
  bVar13 = 0;
  bVar12 = 1;
  bVar11 = 0;
  bVar10 = 0;
  bVar9 = 0;
  bVar8 = 0;
  param = OBJSENSE;
  m = SLUFactor<double>::markowitz(&in_RDI->_slufactor);
  local_4c = intParam(in_RDI,RATIOTESTER);
  local_50 = intParam(in_RDI,PRICER);
  local_54 = intParam(in_RDI,SIMPLIFIER);
  local_58 = intParam(in_RDI,SCALER);
  local_5c = intParam(in_RDI,ALGORITHM);
  if ((in_stack_00000010 & 1) != 0) {
    setIntParam((SoPlexBase<double> *)
                CONCAT17(uVar15,CONCAT16(uVar14,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(bVar11,
                                                  CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))),param,
                in_stack_ffffffffffffffc0,SUB81((ulong)m >> 0x38,0));
  }
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    SVar1 = _solveRealForRational
                                      (in_stack_00000410,(bool)in_stack_0000040f,in_stack_00000400,
                                       in_stack_000003f8,in_stack_000003f0,in_stack_000003e8);
                    local_d1 = 1;
                    if ((SVar1 != OPTIMAL) &&
                       ((SVar1 != INFEASIBLE || (local_d1 = 1, (in_DL & 1) == 0)))) {
                      local_d2 = 0;
                      if (SVar1 == UNBOUNDED) {
                        local_d2 = in_SIL & 1;
                      }
                      local_d1 = local_d2;
                    }
                    if (((local_d1 != 0) || (SVar1 == ABORT_TIME)) || (SVar1 == ABORT_ITER))
                    goto LAB_00469f4a;
                    if ((bVar12 & 1) != 0) {
                      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                         (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                        local_60 = SPxOut::getVerbosity(&in_RDI->spxout);
                        local_64 = INFO1;
                        SPxOut::setVerbosity(&in_RDI->spxout,&local_64);
                        soplex::operator<<(in_stack_ffffffffffffff00,
                                           (char *)in_stack_fffffffffffffef8);
                        soplex::operator<<(in_stack_ffffffffffffff00,
                                           (_func_ostream_ptr_ostream_ptr *)
                                           in_stack_fffffffffffffef8);
                        SPxOut::setVerbosity(&in_RDI->spxout,&local_60);
                      }
                      bVar12 = 0;
                    }
                    if (((param & REPRESENTATION) != OBJSENSE) ||
                       ((iVar3 = intParam(in_RDI,SIMPLIFIER), iVar3 == 0 &&
                        (iVar3 = intParam(in_RDI,SCALER), iVar3 == 0)))) break;
                    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                       (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                      local_70[2] = SPxOut::getVerbosity(&in_RDI->spxout);
                      local_70[1] = 3;
                      SPxOut::setVerbosity(&in_RDI->spxout,local_70 + 1);
                      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8
                                        );
                      soplex::operator<<(in_stack_ffffffffffffff00,
                                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8)
                      ;
                      SPxOut::setVerbosity(&in_RDI->spxout,local_70 + 2);
                    }
                    param = CONCAT31((int3)(param >> 8),1);
                    setIntParam((SoPlexBase<double> *)
                                CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,
                                                  CONCAT13(bVar11,CONCAT12(bVar10,CONCAT11(bVar9,
                                                  bVar8))))))),param,in_stack_ffffffffffffffc0,
                                SUB81((ulong)m >> 0x38,0));
                    setIntParam((SoPlexBase<double> *)
                                CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,
                                                  CONCAT13(bVar11,CONCAT12(bVar10,CONCAT11(bVar9,
                                                  bVar8))))))),param,in_stack_ffffffffffffffc0,
                                SUB81((ulong)m >> 0x38,0));
                    uVar15 = 1;
                    bVar13 = 1;
                  }
                  setIntParam((SoPlexBase<double> *)
                              CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,
                                                  CONCAT13(bVar11,CONCAT12(bVar10,CONCAT11(bVar9,
                                                  bVar8))))))),param,in_stack_ffffffffffffffc0,
                              SUB81((ulong)m >> 0x38,0));
                  setIntParam((SoPlexBase<double> *)
                              CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,
                                                  CONCAT13(bVar11,CONCAT12(bVar10,CONCAT11(bVar9,
                                                  bVar8))))))),param,in_stack_ffffffffffffffc0,
                              SUB81((ulong)m >> 0x38,0));
                  if ((bVar11 & 1) != 0) break;
                  if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                     (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                    local_70[0] = SPxOut::getVerbosity(&in_RDI->spxout);
                    local_74 = INFO1;
                    SPxOut::setVerbosity(&in_RDI->spxout,&local_74);
                    soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
                    soplex::operator<<(in_stack_ffffffffffffff00,
                                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
                    SPxOut::setVerbosity(&in_RDI->spxout,local_70);
                  }
                  SLUFactor<double>::setMarkowitz(&in_RDI->_slufactor,0.9);
                  bVar11 = 1;
                  SPxSolverBase<double>::factorize((SPxSolverBase<double> *)basisStatusCols);
                }
                if ((bVar13 & 1) != 0) break;
                if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                   (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                  local_90[2] = SPxOut::getVerbosity(&in_RDI->spxout);
                  local_90[1] = 3;
                  SPxOut::setVerbosity(&in_RDI->spxout,local_90 + 1);
                  soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
                  soplex::operator<<(in_stack_ffffffffffffff00,
                                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
                  SPxOut::setVerbosity(&in_RDI->spxout,local_90 + 2);
                }
                uVar15 = 1;
                bVar13 = 1;
              }
              setIntParam((SoPlexBase<double> *)
                          CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13
                                                  (bVar11,CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))
                                  ),param,in_stack_ffffffffffffffc0,SUB81((ulong)m >> 0x38,0));
              setIntParam((SoPlexBase<double> *)
                          CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13
                                                  (bVar11,CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))
                                  ),param,in_stack_ffffffffffffffc0,SUB81((ulong)m >> 0x38,0));
              if ((bVar8 & 1) != 0) break;
              if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                 (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                local_90[0] = SPxOut::getVerbosity(&in_RDI->spxout);
                local_94 = INFO1;
                SPxOut::setVerbosity(&in_RDI->spxout,&local_94);
                soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
                soplex::operator<<(in_stack_ffffffffffffff00,
                                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
                SPxOut::setVerbosity(&in_RDI->spxout,local_90);
              }
              bVar7 = SUB81((ulong)m >> 0x38,0);
              if (local_58 == 0) {
                setIntParam((SoPlexBase<double> *)
                            CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,
                                                  CONCAT13(bVar11,CONCAT12(bVar10,CONCAT11(bVar9,
                                                  bVar8))))))),param,in_stack_ffffffffffffffc0,bVar7
                           );
              }
              else {
                setIntParam((SoPlexBase<double> *)
                            CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,
                                                  CONCAT13(bVar11,CONCAT12(bVar10,CONCAT11(bVar9,
                                                  bVar8))))))),param,in_stack_ffffffffffffffc0,bVar7
                           );
              }
              uVar15 = 1;
              bVar13 = 1;
              bVar8 = 1;
            }
            if (((param & 0x1000000) != OBJSENSE) || ((in_stack_00000010 & 1) != 0)) break;
            if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
               (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
              local_a0[2] = SPxOut::getVerbosity(&in_RDI->spxout);
              local_a0[1] = 3;
              SPxOut::setVerbosity(&in_RDI->spxout,local_a0 + 1);
              soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
              soplex::operator<<(in_stack_ffffffffffffff00,
                                 (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
              SPxOut::setVerbosity(&in_RDI->spxout,local_a0 + 2);
            }
            bVar7 = SUB81((ulong)m >> 0x38,0);
            if (local_54 == 0) {
              setIntParam((SoPlexBase<double> *)
                          CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13
                                                  (bVar11,CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))
                                  ),param,in_stack_ffffffffffffffc0,bVar7);
            }
            else {
              setIntParam((SoPlexBase<double> *)
                          CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13
                                                  (bVar11,CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))
                                  ),param,in_stack_ffffffffffffffc0,bVar7);
            }
            uVar15 = 1;
            bVar13 = 1;
            param = CONCAT13(1,(int3)param);
          }
          setIntParam((SoPlexBase<double> *)
                      CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(
                                                  bVar11,CONCAT12(bVar10,CONCAT11(bVar9,bVar8)))))))
                      ,param,in_stack_ffffffffffffffc0,SUB81((ulong)m >> 0x38,0));
          if ((bVar10 & 1) != 0) break;
          if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
             (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
            local_a0[0] = SPxOut::getVerbosity(&in_RDI->spxout);
            local_a4 = INFO1;
            SPxOut::setVerbosity(&in_RDI->spxout,&local_a4);
            soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
            soplex::operator<<(in_stack_ffffffffffffff00,
                               (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
            SPxOut::setVerbosity(&in_RDI->spxout,local_a0);
          }
          setIntParam((SoPlexBase<double> *)
                      CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(
                                                  bVar11,CONCAT12(bVar10,CONCAT11(bVar9,bVar8)))))))
                      ,param,in_stack_ffffffffffffffc0,SUB81((ulong)m >> 0x38,0));
          dVar6 = SPxSolverBase<double>::entertol(in_stack_fffffffffffffef8);
          if (dVar6 <= 1e-06) {
            SPxSolverBase<double>::scaleEntertol(&in_RDI->_solver,1000.0);
          }
          else {
            dVar6 = SPxSolverBase<double>::entertol(in_stack_fffffffffffffef8);
            SPxSolverBase<double>::scaleEntertol(&in_RDI->_solver,0.001 / dVar6);
          }
          dVar6 = SPxSolverBase<double>::leavetol(in_stack_fffffffffffffef8);
          if (dVar6 <= 1e-06) {
            SPxSolverBase<double>::scaleLeavetol(&in_RDI->_solver,1000.0);
          }
          else {
            dVar6 = SPxSolverBase<double>::leavetol(in_stack_fffffffffffffef8);
            SPxSolverBase<double>::scaleLeavetol(&in_RDI->_solver,0.001 / dVar6);
          }
          dVar6 = SPxSolverBase<double>::entertol(in_stack_fffffffffffffef8);
          bVar10 = 0.001 <= dVar6;
          bVar13 = 0;
        }
        if (((bVar9 & 1) != 0) || (SVar1 == INFEASIBLE)) break;
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
          local_b0[2] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_b0[1] = 3;
          SPxOut::setVerbosity(&in_RDI->spxout,local_b0 + 1);
          soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
          soplex::operator<<(in_stack_ffffffffffffff00,
                             (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
          SPxOut::setVerbosity(&in_RDI->spxout,local_b0 + 2);
        }
        setIntParam((SoPlexBase<double> *)
                    CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(
                                                  bVar11,CONCAT12(bVar10,CONCAT11(bVar9,bVar8)))))))
                    ,param,in_stack_ffffffffffffffc0,SUB81((ulong)m >> 0x38,0));
        dVar6 = SPxSolverBase<double>::entertol(in_stack_fffffffffffffef8);
        if (1e-06 <= dVar6) {
          SPxSolverBase<double>::scaleEntertol(&in_RDI->_solver,0.001);
        }
        else {
          in_stack_ffffffffffffff10 = &in_RDI->_solver;
          dVar6 = SPxSolverBase<double>::entertol(in_stack_fffffffffffffef8);
          SPxSolverBase<double>::scaleEntertol(in_stack_ffffffffffffff10,1e-09 / dVar6);
        }
        dVar6 = SPxSolverBase<double>::entertol(in_stack_fffffffffffffef8);
        bVar9 = dVar6 <= 1e-09;
        bVar13 = 0;
      }
      setIntParam((SoPlexBase<double> *)
                  CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(bVar11,
                                                  CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))),param,
                  in_stack_ffffffffffffffc0,SUB81((ulong)m >> 0x38,0));
      if ((param & 0x10000) != OBJSENSE) break;
      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
        local_b0[0] = SPxOut::getVerbosity(&in_RDI->spxout);
        local_b4 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_b4);
        soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
        soplex::operator<<(in_stack_ffffffffffffff00,
                           (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
        SPxOut::setVerbosity(&in_RDI->spxout,local_b0);
      }
      in_stack_ffffffffffffff08 = &in_RDI->_solver;
      SPxSolverBase<double>::type(&in_RDI->_solver);
      SPxSolverBase<double>::setType
                (in_stack_ffffffffffffff10,(Type)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      pSVar4 = SPxSolverBase<double>::ratiotester(&in_RDI->_solver);
      bVar7 = SUB81((ulong)m >> 0x38,0);
      if (pSVar4 == &(in_RDI->_ratiotesterTextbook).super_SPxRatioTester<double>) {
        setIntParam((SoPlexBase<double> *)
                    CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(
                                                  bVar11,CONCAT12(bVar10,CONCAT11(bVar9,bVar8)))))))
                    ,param,in_stack_ffffffffffffffc0,bVar7);
      }
      else {
        setIntParam((SoPlexBase<double> *)
                    CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(
                                                  bVar11,CONCAT12(bVar10,CONCAT11(bVar9,bVar8)))))))
                    ,param,in_stack_ffffffffffffffc0,bVar7);
      }
      param = CONCAT13((char)(param >> 0x18),CONCAT12(1,(short)param));
      bVar13 = 0;
    }
    if ((param & 0x100) != OBJSENSE) break;
    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
       (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
      local_c0[2] = SPxOut::getVerbosity(&in_RDI->spxout);
      local_c0[1] = 3;
      SPxOut::setVerbosity(&in_RDI->spxout,local_c0 + 1);
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
      SPxOut::setVerbosity(&in_RDI->spxout,local_c0 + 2);
    }
    in_stack_ffffffffffffff00 = (SPxOut *)&in_RDI->_solver;
    SPxSolverBase<double>::type(&in_RDI->_solver);
    SPxSolverBase<double>::setType
              (in_stack_ffffffffffffff10,(Type)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    pSVar5 = SPxSolverBase<double>::pricer(&in_RDI->_solver);
    bVar7 = SUB81((ulong)m >> 0x38,0);
    if ((SPxDevexPR<double> *)pSVar5 == &in_RDI->_pricerDevex) {
      setIntParam((SoPlexBase<double> *)
                  CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(bVar11,
                                                  CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))),param,
                  in_stack_ffffffffffffffc0,bVar7);
    }
    else {
      setIntParam((SoPlexBase<double> *)
                  CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(bVar11,
                                                  CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))),param,
                  in_stack_ffffffffffffffc0,bVar7);
    }
    param = CONCAT22((short)(param >> 0x10),CONCAT11(1,(char)param));
    bVar13 = 0;
  }
  if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
     (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
    local_c0[0] = SPxOut::getVerbosity(&in_RDI->spxout);
    local_c4 = INFO1;
    SPxOut::setVerbosity(&in_RDI->spxout,&local_c4);
    soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    soplex::operator<<(in_stack_ffffffffffffff00,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
    SPxOut::setVerbosity(&in_RDI->spxout,local_c0);
  }
LAB_00469f4a:
  SLUFactor<double>::setMarkowitz(&in_RDI->_slufactor,m);
  bVar7 = SUB81((ulong)m >> 0x38,0);
  setIntParam((SoPlexBase<double> *)
              CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(bVar11,
                                                  CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))),param,
              in_stack_ffffffffffffffc0,bVar7);
  setIntParam((SoPlexBase<double> *)
              CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(bVar11,
                                                  CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))),param,
              in_stack_ffffffffffffffc0,bVar7);
  setIntParam((SoPlexBase<double> *)
              CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(bVar11,
                                                  CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))),param,
              in_stack_ffffffffffffffc0,bVar7);
  setIntParam((SoPlexBase<double> *)
              CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(bVar11,
                                                  CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))),param,
              in_stack_ffffffffffffffc0,bVar7);
  setIntParam((SoPlexBase<double> *)
              CONCAT17(uVar15,CONCAT16(local_d1,CONCAT15(bVar13,CONCAT14(bVar12,CONCAT13(bVar11,
                                                  CONCAT12(bVar10,CONCAT11(bVar9,bVar8))))))),param,
              in_stack_ffffffffffffffc0,bVar7);
  return SVar1;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealStable(bool acceptUnbounded,
      bool acceptInfeasible, VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const bool forceNoSimplifier)
{
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   bool fromScratch = false;
   bool solved = false;
   bool solvedFromScratch = false;
   bool initialSolve = true;
   bool increasedMarkowitz = false;
   bool relaxedTolerances = false;
   bool tightenedTolerances = false;
   bool switchedScaler = false;
   bool switchedSimplifier = false;
   bool switchedRatiotester = false;
   bool switchedPricer = false;
   bool turnedoffPre = false;

   R markowitz = _slufactor.markowitz();
   int ratiotester = intParam(SoPlexBase<R>::RATIOTESTER);
   int pricer = intParam(SoPlexBase<R>::PRICER);
   int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);
   int scaler = intParam(SoPlexBase<R>::SCALER);
   int type = intParam(SoPlexBase<R>::ALGORITHM);

   if(forceNoSimplifier)
      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

   while(true)
   {
      assert(!increasedMarkowitz || GE(_slufactor.markowitz(), R(0.9), this->tolerances()->epsilon()));

      result = _solveRealForRational(fromScratch, primal, dual, basisStatusRows, basisStatusCols);

      solved = (result == SPxSolverBase<R>::OPTIMAL)
               || (result == SPxSolverBase<R>::INFEASIBLE && acceptInfeasible)
               || (result == SPxSolverBase<R>::UNBOUNDED && acceptUnbounded);

      if(solved || result == SPxSolverBase<R>::ABORT_TIME || result == SPxSolverBase<R>::ABORT_ITER)
         break;

      if(initialSolve)
      {
         SPX_MSG_INFO1(spxout, spxout << "Numerical troubles during floating-point solve." << std::endl);
         initialSolve = false;
      }

      if(!turnedoffPre
            && (intParam(SoPlexBase<R>::SIMPLIFIER) != SoPlexBase<R>::SIMPLIFIER_OFF
                || intParam(SoPlexBase<R>::SCALER) != SoPlexBase<R>::SCALER_OFF))
      {
         SPX_MSG_INFO1(spxout, spxout << "Turning off preprocessing." << std::endl);

         turnedoffPre = true;

         setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);
         setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SCALER, scaler);
      setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);

      if(!increasedMarkowitz)
      {
         SPX_MSG_INFO1(spxout, spxout << "Increasing Markowitz threshold." << std::endl);

         _slufactor.setMarkowitz(0.9);
         increasedMarkowitz = true;

         try
         {
            _solver.factorize();
            continue;
         }
         catch(...)
         {
            SPxOut::debug(this, "Factorization failed.\n");
         }
      }

      if(!solvedFromScratch)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solving from scratch." << std::endl);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
      setIntParam(SoPlexBase<R>::PRICER, pricer);

      if(!switchedScaler)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching scaling." << std::endl);

         if(scaler == int(SoPlexBase<R>::SCALER_OFF))
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_BIEQUI);
         else
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedScaler = true;
         continue;
      }

      if(!switchedSimplifier && !forceNoSimplifier)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching simplification." << std::endl);

         if(simplifier == int(SoPlexBase<R>::SIMPLIFIER_OFF))
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_INTERNAL);
         else
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedSimplifier = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

      if(!relaxedTolerances)
      {
         SPX_MSG_INFO1(spxout, spxout << "Relaxing tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_PRIMAL);

         // scale tols by up 1e3 but so that they do not exceed 1e-3
         if(_solver.entertol() > 1e-6)
            _solver.scaleEntertol(1e-3 / _solver.entertol());
         else
            _solver.scaleEntertol(1e3);

         if(_solver.leavetol() > 1e-6)
            _solver.scaleLeavetol(1e-3 / _solver.leavetol());
         else
            _solver.scaleLeavetol(1e3);

         relaxedTolerances = _solver.entertol() >= 1e-3;
         solvedFromScratch = false;
         continue;
      }

      if(!tightenedTolerances && result != SPxSolverBase<R>::INFEASIBLE)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tightening tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_DUAL);

         // scale tols by up 1e-3 but so that they are not smaller than 1e-9
         if(_solver.entertol() < 1e-6)
            _solver.scaleEntertol(1e-9 / _solver.entertol());
         else
            _solver.scaleEntertol(1e-3);

         tightenedTolerances = _solver.entertol() <= 1e-9;
         solvedFromScratch = false;
         continue;
      }

      setIntParam(SoPlexBase<R>::ALGORITHM, type);

      if(!switchedRatiotester)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching ratio test." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.ratiotester() != (SPxRatioTester<R>*)&_ratiotesterTextbook)
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_TEXTBOOK);
         else
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_FAST);

         switchedRatiotester = true;
         solvedFromScratch = false;
         continue;
      }

      if(!switchedPricer)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching pricer." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.pricer() != (SPxPricer<R>*)&_pricerDevex)
            setIntParam(SoPlexBase<R>::PRICER, PRICER_DEVEX);
         else
            setIntParam(SoPlexBase<R>::PRICER, PRICER_STEEP);

         switchedPricer = true;
         solvedFromScratch = false;
         continue;
      }

      SPX_MSG_INFO1(spxout, spxout << "Giving up." << std::endl);

      break;
   }

   _slufactor.setMarkowitz(markowitz);

   setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
   setIntParam(SoPlexBase<R>::PRICER, pricer);
   setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
   setIntParam(SoPlexBase<R>::SCALER, scaler);
   setIntParam(SoPlexBase<R>::ALGORITHM, type);

   return result;
}